

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_tree.c
# Opt level: O3

ly_bool trop_leaf_is_key(lysp_node *pn,lysp_node_list *ca_last_list)

{
  char *__needle;
  byte *pbVar1;
  size_t sVar2;
  byte *__haystack;
  byte bVar3;
  lysp_node_list *list;
  lysp_node_leaf *leaf;
  
  if (ca_last_list == (lysp_node_list *)0x0) {
    return '\0';
  }
  __haystack = (byte *)ca_last_list->key;
  if (((__haystack != (byte *)0x0) && (bVar3 = *__haystack, bVar3 != 0)) &&
     (__needle = pn->name, __needle != (char *)0x0)) {
    do {
      pbVar1 = (byte *)strstr((char *)__haystack,__needle);
      if (pbVar1 == (byte *)0x0) {
        return '\0';
      }
      if (((pbVar1 == __haystack) || (pbVar1[-1] == 0x20)) &&
         (sVar2 = strlen(__needle), (pbVar1[sVar2] & 0xdf) == 0)) {
        return '\x01';
      }
      while ((bVar3 & 0xdf) != 0) {
        pbVar1 = __haystack + 1;
        __haystack = __haystack + 1;
        bVar3 = *pbVar1;
      }
      __haystack = __haystack + (bVar3 != 0);
      bVar3 = *__haystack;
    } while (bVar3 != 0);
  }
  return '\0';
}

Assistant:

static ly_bool
trop_leaf_is_key(const struct lysp_node *pn, const struct lysp_node_list *ca_last_list)
{
    const struct lysp_node_leaf *leaf = (const struct lysp_node_leaf *)pn;
    const struct lysp_node_list *list = ca_last_list;

    if (!list) {
        return 0;
    }
    return trg_charptr_has_data(list->key) ?
           trg_word_is_present(list->key, leaf->name, ' ') : 0;
}